

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O0

void __thiscall
cmDebugServerConsole::OnBreakpoint(cmDebugServerConsole *this,breakpoint_id breakpoint)

{
  ostream *poVar1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190;
  breakpoint_id local_18;
  breakpoint_id breakpoint_local;
  cmDebugServerConsole *this_local;
  
  local_18 = breakpoint;
  breakpoint_local = (breakpoint_id)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(&local_190,"# Breakpoint ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1," hit");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,(string *)&PROMPT_abi_cxx11_);
  std::__cxx11::stringstream::str();
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void cmDebugServerConsole::OnBreakpoint(breakpoint_id breakpoint)
{
  std::stringstream ss;
  ss << "# Breakpoint " << breakpoint << " hit" << std::endl << PROMPT;

  AsyncBroadcast(ss.str());
}